

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNodePtr * cuddNodeArray(DdNode *f,int *n)

{
  int iVar1;
  int iVar2;
  DdNodePtr *table;
  
  iVar1 = ddDagInt((DdNode *)((ulong)f & 0xfffffffffffffffe));
  table = (DdNodePtr *)malloc((long)iVar1 << 3);
  if (table == (DdNodePtr *)0x0) {
    ddClearFlag((DdNode *)((ulong)f & 0xfffffffffffffffe));
  }
  else {
    iVar2 = cuddNodeArrayRecur(f,table,0);
    if (iVar2 != iVar1) {
      __assert_fail("retval == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddUtil.c"
                    ,0xbaa,"DdNodePtr *cuddNodeArray(DdNode *, int *)");
    }
    *n = iVar1;
  }
  return table;
}

Assistant:

DdNodePtr *
cuddNodeArray(
  DdNode *f,
  int *n)
{
    DdNodePtr *table;
    int size, retval;

    size = ddDagInt(Cudd_Regular(f));
    table = ABC_ALLOC(DdNodePtr, size);
    if (table == NULL) {
        ddClearFlag(Cudd_Regular(f));
        return(NULL);
    }

    retval = cuddNodeArrayRecur(f, table, 0);
    assert(retval == size);

    *n = size;
    return(table);

}